

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O1

void dynamic_suite::run(void)

{
  test_null();
  test_boolean();
  test_integer();
  test_number();
  test_string();
  test_array_empty();
  test_array();
  test_map_empty();
  test_map();
  return;
}

Assistant:

void run()
{
    test_null();
    test_boolean();
    test_integer();
    test_number();
    test_string();
    test_array_empty();
    test_array();
    test_map_empty();
    test_map();
}